

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::String(String *this,char *str,usize length)

{
  char *pcVar1;
  Data *pDVar2;
  usize capacity;
  usize length_local;
  char *str_local;
  String *this_local;
  
  pDVar2 = (Data *)operator_new__((length | 3) + 0x21);
  this->data = pDVar2;
  this->data->str = (char *)(this->data + 1);
  Memory::copy((Memory *)this->data->str,(EVP_PKEY_CTX *)str,(EVP_PKEY_CTX *)length);
  pcVar1 = this->data->str;
  this->data->len = length;
  pcVar1[length] = '\0';
  this->data->ref = 1;
  this->data->capacity = length | 3;
  return;
}

Assistant:

String(const char* str, usize length)
  {
    usize capacity = length | 0x3;
    data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    data->str = (char*)((byte*)data + sizeof(Data));
    Memory::copy((char*)data->str, str, length * sizeof(char));
    ((char*)data->str)[data->len = length] = '\0';
    data->ref = 1;
    data->capacity = capacity;
  }